

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD5Importer::LoadMD5CameraFile(MD5Importer *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  float fVar3;
  uint uVar4;
  pointer pcVar5;
  IOSystem *pIVar6;
  aiScene *paVar7;
  int iVar8;
  ai_uint32 aVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiNode *this_01;
  aiNode **ppaVar13;
  aiNode *this_02;
  aiCamera **ppaVar14;
  aiCamera *paVar15;
  long lVar16;
  aiAnimation **ppaVar17;
  aiAnimation *paVar18;
  aiNodeAnim **ppaVar19;
  aiNodeAnim *paVar20;
  aiVectorKey *paVar21;
  aiQuatKey *paVar22;
  runtime_error *prVar23;
  ulong uVar24;
  aiQuatKey *paVar25;
  const_iterator it;
  uint *puVar26;
  float fVar27;
  float fVar28;
  MD5CameraParser cameraParser;
  string pFile;
  MD5Parser parser;
  string local_d8;
  undefined1 local_b8 [32];
  pointer local_98;
  pointer local_90;
  pointer local_88;
  IOStream *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  MD5Parser local_58;
  IOStream *pIVar12;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar5 = (this->mFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar5,pcVar5 + (this->mFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  pIVar6 = this->pIOHandler;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"rb","");
  iVar8 = (*pIVar6->_vptr_IOSystem[4])(pIVar6,local_78._M_dataplus._M_p,local_b8._0_8_);
  pIVar12 = (IOStream *)CONCAT44(extraout_var,iVar8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  local_80 = pIVar12;
  if (pIVar12 != (IOStream *)0x0) {
    iVar8 = (*pIVar12->_vptr_IOStream[6])(pIVar12);
    if (CONCAT44(extraout_var_00,iVar8) != 0) {
      this->bHadMD5Camera = true;
      LoadFileIntoMemory(this,pIVar12);
      MD5::MD5Parser::MD5Parser(&local_58,this->mBuffer,this->fileSize);
      MD5::MD5CameraParser::MD5CameraParser((MD5CameraParser *)local_b8,&local_58.mSections);
      if (local_98 != local_90) {
        this_01 = (aiNode *)operator_new(0x478);
        paVar2 = &local_d8.field_2;
        local_d8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"<MD5CameraRoot>","");
        aiNode::aiNode(this_01,&local_d8);
        this->pScene->mRootNode = this_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        this_01->mNumChildren = 1;
        ppaVar13 = (aiNode **)operator_new__(8);
        this_01->mChildren = ppaVar13;
        this_02 = (aiNode *)operator_new(0x478);
        local_d8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"<MD5Camera>","");
        aiNode::aiNode(this_02,&local_d8);
        *this_01->mChildren = this_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        (*this_01->mChildren)->mParent = this_01;
        this->pScene->mNumCameras = 1;
        ppaVar14 = (aiCamera **)operator_new__(8);
        this->pScene->mCameras = ppaVar14;
        paVar15 = (aiCamera *)operator_new(0x438);
        this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_b8 + 8);
        (paVar15->mName).length = 0;
        (paVar15->mName).data[0] = '\0';
        memset((paVar15->mName).data + 1,0x1b,0x3ff);
        (paVar15->mPosition).x = 0.0;
        (paVar15->mPosition).y = 0.0;
        *(undefined8 *)&(paVar15->mPosition).z = 0;
        (paVar15->mUp).y = 1.0;
        (paVar15->mUp).z = 0.0;
        (paVar15->mLookAt).x = 0.0;
        (paVar15->mLookAt).y = 0.0;
        *(undefined8 *)&(paVar15->mLookAt).z = 0x3f490fdb3f800000;
        paVar15->mClipPlaneNear = 0.1;
        paVar15->mClipPlaneFar = 1000.0;
        paVar15->mAspect = 0.0;
        *this->pScene->mCameras = paVar15;
        (paVar15->mName).length = 0xb;
        builtin_strncpy((paVar15->mName).data,"<MD5Camera>",0xc);
        paVar15->mHorizontalFOV = local_98->fFOV * 0.017453292;
        if (local_b8._16_8_ == local_b8._8_8_) {
          local_d8._M_dataplus._M_p = (pointer)((ulong)local_d8._M_dataplus._M_p._4_4_ << 0x20);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)&local_d8);
          local_d8._M_dataplus._M_p._0_4_ =
               (int)((ulong)((long)local_90 - (long)local_98) >> 2) * -0x49249249 + -1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)&local_d8);
        }
        else {
          local_d8._M_dataplus._M_p = (pointer)((ulong)local_d8._M_dataplus._M_p._4_4_ << 0x20);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                    (this_00,(const_iterator)local_b8._8_8_,(value_type_conflict1 *)&local_d8);
          lVar16 = ((long)local_90 - (long)local_98 >> 2) * 0x6db6db6db6db6db7;
          if ((ulong)*(uint *)(local_b8._16_8_ - 4) < lVar16 - 1U) {
            local_d8._M_dataplus._M_p._0_4_ = (int)lVar16 + -1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (this_00,(uint *)&local_d8);
          }
        }
        puVar26 = (uint *)local_b8._8_8_;
        this->pScene->mNumAnimations = (int)((ulong)(local_b8._16_8_ - local_b8._8_8_) >> 2) - 1;
        paVar7 = this->pScene;
        ppaVar17 = (aiAnimation **)operator_new__((ulong)paVar7->mNumAnimations << 3);
        paVar7->mAnimations = ppaVar17;
        for (; puVar26 != (uint *)(local_b8._16_8_ - 4); puVar26 = puVar26 + 1) {
          paVar18 = (aiAnimation *)operator_new(0x448);
          (paVar18->mName).length = 0;
          (paVar18->mName).data[0] = '\0';
          memset((paVar18->mName).data + 1,0x1b,0x3ff);
          paVar18->mDuration = -1.0;
          paVar18->mTicksPerSecond = 0.0;
          paVar18->mNumChannels = 0;
          paVar18->mChannels = (aiNodeAnim **)0x0;
          paVar18->mNumMeshChannels = 0;
          paVar18->mMeshChannels = (aiMeshAnim **)0x0;
          paVar18->mNumMorphMeshChannels = 0;
          paVar18->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
          *ppaVar17 = paVar18;
          aVar9 = snprintf((paVar18->mName).data,0x400,"anim%u_from_%u_to_%u",
                           (ulong)((long)puVar26 - local_b8._8_8_) >> 2,(ulong)*puVar26,
                           (ulong)puVar26[1]);
          (paVar18->mName).length = aVar9;
          paVar18->mTicksPerSecond = (double)(float)local_b8._0_4_;
          paVar18->mNumChannels = 1;
          ppaVar19 = (aiNodeAnim **)operator_new__(8);
          paVar18->mChannels = ppaVar19;
          paVar20 = (aiNodeAnim *)operator_new(0x438);
          (paVar20->mNodeName).length = 0;
          (paVar20->mNodeName).data[0] = '\0';
          memset((paVar20->mNodeName).data + 1,0x1b,0x3ff);
          paVar20->mRotationKeys = (aiQuatKey *)0x0;
          paVar20->mNumScalingKeys = 0;
          *(undefined8 *)&paVar20->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar20->mPositionKeys + 4) = 0;
          paVar20->mScalingKeys = (aiVectorKey *)0x0;
          paVar20->mPreState = aiAnimBehaviour_DEFAULT;
          paVar20->mPostState = aiAnimBehaviour_DEFAULT;
          *ppaVar19 = paVar20;
          (paVar20->mNodeName).length = 0xb;
          builtin_strncpy((paVar20->mNodeName).data,"<MD5Camera>",0xc);
          uVar11 = *puVar26;
          uVar4 = puVar26[1];
          uVar10 = uVar4 - uVar11;
          paVar20->mNumRotationKeys = uVar10;
          paVar20->mNumPositionKeys = uVar10;
          paVar21 = (aiVectorKey *)operator_new__((ulong)uVar10 * 0x18);
          if (uVar4 != uVar11) {
            uVar24 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar21->mTime + uVar24);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar21->mValue).z + uVar24) = 0;
              uVar24 = uVar24 + 0x18;
            } while ((ulong)uVar10 * 0x18 != uVar24);
          }
          paVar20->mPositionKeys = paVar21;
          uVar24 = (ulong)paVar20->mNumRotationKeys;
          paVar22 = (aiQuatKey *)operator_new__(uVar24 * 0x18);
          if (uVar24 != 0) {
            paVar25 = paVar22;
            do {
              paVar25->mTime = 0.0;
              (paVar25->mValue).w = 1.0;
              (paVar25->mValue).x = 0.0;
              (paVar25->mValue).y = 0.0;
              (paVar25->mValue).z = 0.0;
              paVar25 = paVar25 + 1;
            } while (paVar25 != paVar22 + uVar24);
          }
          paVar20->mRotationKeys = paVar22;
          if (paVar20->mNumPositionKeys != 0) {
            lVar16 = 0;
            uVar24 = 0;
            do {
              uVar11 = *puVar26;
              iVar8 = (int)uVar24;
              paVar21 = paVar20->mPositionKeys;
              *(float *)((long)&(paVar21->mValue).z + lVar16) =
                   local_98[uVar11 + iVar8].super_BaseFrameDesc.vPositionXYZ.z;
              *(undefined8 *)((long)&(paVar21->mValue).x + lVar16) =
                   *(undefined8 *)&local_98[uVar11 + iVar8].super_BaseFrameDesc.vPositionXYZ;
              uVar11 = *puVar26 + iVar8;
              paVar22 = paVar20->mRotationKeys;
              *(float *)((long)&(paVar22->mValue).x + lVar16) =
                   local_98[uVar11].super_BaseFrameDesc.vRotationQuat.x;
              *(float *)((long)&(paVar22->mValue).y + lVar16) =
                   local_98[uVar11].super_BaseFrameDesc.vRotationQuat.y;
              *(float *)((long)&(paVar22->mValue).z + lVar16) =
                   local_98[uVar11].super_BaseFrameDesc.vRotationQuat.z;
              fVar27 = local_98[uVar11].super_BaseFrameDesc.vRotationQuat.x;
              fVar28 = local_98[uVar11].super_BaseFrameDesc.vRotationQuat.y;
              fVar3 = local_98[uVar11].super_BaseFrameDesc.vRotationQuat.z;
              fVar27 = ((1.0 - fVar27 * fVar27) - fVar28 * fVar28) - fVar3 * fVar3;
              fVar28 = 0.0;
              if (0.0 <= fVar27) {
                if (fVar27 < 0.0) {
                  fVar28 = sqrtf(fVar27);
                }
                else {
                  fVar28 = SQRT(fVar27);
                }
              }
              *(float *)((long)&(paVar22->mValue).w + lVar16) = -fVar28;
              uVar11 = *puVar26;
              *(double *)((long)&paVar20->mPositionKeys->mTime + lVar16) = (double)(uVar11 + iVar8);
              *(double *)((long)&paVar20->mRotationKeys->mTime + lVar16) = (double)(uVar11 + iVar8);
              uVar24 = uVar24 + 1;
              lVar16 = lVar16 + 0x18;
            } while (uVar24 < paVar20->mNumPositionKeys);
          }
          ppaVar17 = ppaVar17 + 1;
        }
        if (local_98 != (pointer)0x0) {
          operator_delete(local_98,(long)local_88 - (long)local_98);
        }
        pIVar12 = local_80;
        if ((uint *)local_b8._8_8_ != (uint *)0x0) {
          operator_delete((void *)local_b8._8_8_,local_b8._24_8_ - local_b8._8_8_);
        }
        std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
                  (&local_58.mSections);
        (*pIVar12->_vptr_IOStream[1])(pIVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"MD5CAMERA: No frames parsed","");
      std::runtime_error::runtime_error(prVar23,(string *)&local_d8);
      *(undefined ***)prVar23 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "Failed to read MD5CAMERA file: ",&local_78);
  std::runtime_error::runtime_error(prVar23,(string *)local_b8);
  *(undefined ***)prVar23 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD5Importer::LoadMD5CameraFile ()
{
    std::string pFile = mFile + "md5camera";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        throw DeadlyImportError("Failed to read MD5CAMERA file: " + pFile);
    }
    bHadMD5Camera = true;
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the camera animation data from the parse tree
    MD5::MD5CameraParser cameraParser(parser.mSections);

    if (cameraParser.frames.empty()) {
        throw DeadlyImportError("MD5CAMERA: No frames parsed");
    }

    std::vector<unsigned int>& cuts = cameraParser.cuts;
    std::vector<MD5::CameraAnimFrameDesc>& frames = cameraParser.frames;

    // Construct output graph - a simple root with a dummy child.
    // The root node performs the coordinate system conversion
    aiNode* root = pScene->mRootNode = new aiNode("<MD5CameraRoot>");
    root->mChildren = new aiNode*[root->mNumChildren = 1];
    root->mChildren[0] = new aiNode("<MD5Camera>");
    root->mChildren[0]->mParent = root;

    // ... but with one camera assigned to it
    pScene->mCameras = new aiCamera*[pScene->mNumCameras = 1];
    aiCamera* cam = pScene->mCameras[0] = new aiCamera();
    cam->mName = "<MD5Camera>";

    // FIXME: Fov is currently set to the first frame's value
    cam->mHorizontalFOV = AI_DEG_TO_RAD( frames.front().fFOV );

    // every cut is written to a separate aiAnimation
    if (!cuts.size()) {
        cuts.push_back(0);
        cuts.push_back(static_cast<unsigned int>(frames.size()-1));
    }
    else {
        cuts.insert(cuts.begin(),0);

        if (cuts.back() < frames.size()-1)
            cuts.push_back(static_cast<unsigned int>(frames.size()-1));
    }

    pScene->mNumAnimations = static_cast<unsigned int>(cuts.size()-1);
    aiAnimation** tmp = pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations];
    for (std::vector<unsigned int>::const_iterator it = cuts.begin(); it != cuts.end()-1; ++it) {

        aiAnimation* anim = *tmp++ = new aiAnimation();
        anim->mName.length = ::ai_snprintf(anim->mName.data, MAXLEN, "anim%u_from_%u_to_%u",(unsigned int)(it-cuts.begin()),(*it),*(it+1));

        anim->mTicksPerSecond = cameraParser.fFrameRate;
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = 1];
        aiNodeAnim* nd  = anim->mChannels[0] = new aiNodeAnim();
        nd->mNodeName.Set("<MD5Camera>");

        nd->mNumPositionKeys = nd->mNumRotationKeys = *(it+1) - (*it);
        nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];
        nd->mRotationKeys = new aiQuatKey  [nd->mNumRotationKeys];
        for (unsigned int i = 0; i < nd->mNumPositionKeys; ++i) {

            nd->mPositionKeys[i].mValue = frames[*it+i].vPositionXYZ;
            MD5::ConvertQuaternion(frames[*it+i].vRotationQuat,nd->mRotationKeys[i].mValue);
            nd->mRotationKeys[i].mTime = nd->mPositionKeys[i].mTime = *it+i;
        }
    }
}